

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_metric_form
          (REF_NODE ref_node,REF_INT node,REF_DBL m11,REF_DBL m12,REF_DBL m13,REF_DBL m22,
          REF_DBL m23,REF_DBL m33)

{
  uint uVar1;
  REF_DBL m [6];
  REF_DBL local_38;
  REF_DBL local_30;
  REF_DBL local_28;
  REF_DBL local_20;
  REF_DBL local_18;
  REF_DBL local_10;
  
  local_38 = m11;
  local_30 = m12;
  local_28 = m13;
  local_20 = m22;
  local_18 = m23;
  local_10 = m33;
  uVar1 = ref_node_metric_set(ref_node,node,&local_38);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x515,
           "ref_node_metric_form",(ulong)uVar1,"set");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_metric_form(REF_NODE ref_node, REF_INT node,
                                        REF_DBL m11, REF_DBL m12, REF_DBL m13,
                                        REF_DBL m22, REF_DBL m23, REF_DBL m33) {
  REF_DBL m[6];
  m[0] = m11;
  m[1] = m12;
  m[2] = m13;
  m[3] = m22;
  m[4] = m23;
  m[5] = m33;
  RSS(ref_node_metric_set(ref_node, node, m), "set");
  return REF_SUCCESS;
}